

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceArguments.cpp
# Opt level: O0

HRESULT __thiscall
Js::StackTraceArguments::ToString
          (StackTraceArguments *this,LPCWSTR functionName,ScriptContext *scriptContext,
          LPCWSTR *outResult)

{
  code *pcVar1;
  BOOL BVar2;
  JavascriptLibrary *library;
  CompoundString *this_00;
  ulong uVar3;
  JavascriptString *s;
  char16 *pcVar4;
  undefined4 *puVar5;
  bool bVar6;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  uint64 i;
  bool toManyArgs;
  bool calleIsGlobalFunction;
  CompoundString *stringBuilder;
  AutoNestedHandledExceptionType local_3c;
  uint uStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint64 argumentsTypes;
  HRESULT hr;
  LPCWSTR *outResult_local;
  ScriptContext *scriptContext_local;
  LPCWSTR functionName_local;
  StackTraceArguments *this_local;
  
  _uStack_38 = this->types;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  library = ScriptContext::GetLibrary(scriptContext);
  this_00 = CompoundString::NewWithCharCapacity(0x28,library);
  CompoundString::AppendCharsSz(this_00,functionName);
  bVar6 = (_uStack_38 & 0x2000000000000000) == 0;
  uVar3 = _uStack_38 & 0x1000000000000000;
  _uStack_38 = _uStack_38 & 0xcfffffffffffffff;
  if (bVar6) {
    CompoundString::AppendChars(this_00,L'(');
  }
  for (err = (JavascriptException *)0x0; err < (JavascriptException *)0x14 && _uStack_38 != 0;
      err = (JavascriptException *)((long)&err->threadContext + 1)) {
    if (err != (JavascriptException *)0x0) {
      CompoundString::AppendChars<3u>(this_00,(char16 (*) [3])0x17e0690,true);
    }
    s = TypeCodeToTypeName(uStack_38 & 7,scriptContext);
    CompoundString::AppendChars(this_00,s);
    _uStack_38 = _uStack_38 >> 3;
  }
  if (uVar3 != 0) {
    CompoundString::AppendChars<6u>(this_00,(char16 (*) [6])L", ...",true);
  }
  if (bVar6) {
    CompoundString::AppendChars(this_00,L')');
  }
  pcVar4 = JavascriptString::GetString((JavascriptString *)this_00);
  *outResult = pcVar4;
  BVar2 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar2 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/StackTraceArguments.cpp"
                                ,0x7e,
                                "(!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                                "!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar6) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  return 0;
}

Assistant:

HRESULT StackTraceArguments::ToString(LPCWSTR functionName, Js::ScriptContext *scriptContext, _In_ LPCWSTR *outResult) const
    {
        HRESULT hr = S_OK;
        uint64 argumentsTypes = types;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendCharsSz(functionName);
            bool calleIsGlobalFunction = (argumentsTypes & fCallerIsGlobal) != 0;
            bool toManyArgs = (argumentsTypes & fTooManyArgs) != 0;
            argumentsTypes &= ~fCallerIsGlobal; // erase flags to prevent them from being treated as values
            argumentsTypes &= ~fTooManyArgs;
            if (!calleIsGlobalFunction)
            {
                stringBuilder->AppendChars(_u('('));
            }
            for (uint64 i = 0; i < MaxNumberOfDisplayedArgumentsInStack && argumentsTypes != 0; i ++)
            {
                if (i > 0)
                {
                    stringBuilder->AppendChars(_u(", "));
                }
                stringBuilder->AppendChars(TypeCodeToTypeName(argumentsTypes & 7, scriptContext)); // we use 3 bits to store one code
                argumentsTypes >>= 3;
            }
            if (toManyArgs)
            {
                stringBuilder->AppendChars(_u(", ..."));
            }
            if (!calleIsGlobalFunction)
            {
                stringBuilder->AppendChars(_u(')'));
            }
            *outResult = stringBuilder->GetString();
        }